

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualmodel.cpp
# Opt level: O0

QualModel * QualModel::factory(string *model)

{
  bool bVar1;
  string *model_local;
  
  bVar1 = std::operator==(model,"CHEMICAL");
  if (bVar1) {
    model_local = (string *)operator_new(0x68);
    ChemModel::ChemModel((ChemModel *)model_local);
  }
  else {
    bVar1 = std::operator==(model,"TRACE");
    if (bVar1) {
      model_local = (string *)operator_new(0x18);
      TraceModel::TraceModel((TraceModel *)model_local);
    }
    else {
      bVar1 = std::operator==(model,"AGE");
      if (bVar1) {
        model_local = (string *)operator_new(0x10);
        AgeModel::AgeModel((AgeModel *)model_local);
      }
      else {
        model_local = (string *)0x0;
      }
    }
  }
  return (QualModel *)model_local;
}

Assistant:

QualModel* QualModel::factory(const string model)
{
    if ( model == "CHEMICAL" ) return new ChemModel();
    if ( model == "TRACE" )    return new TraceModel();
    if ( model == "AGE" )      return new AgeModel();
    return nullptr;
}